

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O0

LispPTR CHAR_openfile(LispPTR *args)

{
  int iVar1;
  uint uVar2;
  LispPTR *pLVar3;
  ulong uVar4;
  DLword *pDVar5;
  int *piVar6;
  bool bVar7;
  LispPTR local_1074;
  ulong local_1070;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp;
  char pathname [4096];
  int local_20;
  int flags;
  int fd;
  LispPTR *args_local;
  
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
  pLVar3 = NativeAligned4FromLAddr(*args);
  if ((int)pLVar3[2] < 0x1000) {
    local_1074 = pLVar3[2];
  }
  else {
    local_1074 = 0x1000;
  }
  uVar4 = (ulong)(int)local_1074;
  if (*(char *)((long)pLVar3 + 6) == 'C') {
    pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
    lf_i = (size_t)&lf_arrayp;
    lf_dptr = (char *)((long)pDVar5 + (long)(int)(uint)(ushort)pLVar3[1]);
    for (lf_ii = 0; lf_ii < uVar4; lf_ii = lf_ii + 1) {
      *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
      lf_i = lf_i + 1;
      lf_dptr = lf_dptr + 1;
    }
    pathname[uVar4 - 8] = '\0';
  }
  else if (*(char *)((long)pLVar3 + 6) == 'D') {
    pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
    lf_length = (size_t)(pDVar5 + (int)(uint)(ushort)pLVar3[1]);
    lf_sbase = (short *)&lf_arrayp;
    for (local_1070 = 0; local_1070 < uVar4; local_1070 = local_1070 + 1) {
      *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
      lf_length = lf_length + 2;
      lf_sbase = (short *)((long)lf_sbase + 1);
    }
    *(undefined1 *)lf_sbase = 0;
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    switch(args[1]) {
    case 0xe0000:
      local_20 = 0x800;
      break;
    case 0xe0001:
      local_20 = 0x841;
      break;
    case 0xe0002:
      local_20 = 0x842;
      break;
    case 0xe0003:
      local_20 = 0xc42;
      break;
    default:
      return 0;
    }
    alarm(TIMEOUT_TIME);
    do {
      piVar6 = __errno_location();
      *piVar6 = 0;
      iVar1 = open((char *)&lf_arrayp,local_20);
      bVar7 = false;
      if (iVar1 == -1) {
        piVar6 = __errno_location();
        bVar7 = *piVar6 == 4;
      }
    } while (bVar7);
    alarm(0);
    if (iVar1 == -1) {
      piVar6 = __errno_location();
      err_mess("open",*piVar6);
      piVar6 = __errno_location();
      *Lisp_errno = *piVar6;
      args_local._4_4_ = 0;
    }
    else {
      uVar2 = fcntl(iVar1,3,0);
      fcntl(iVar1,4,(ulong)(uVar2 | 0x800));
      args_local._4_4_ = GetSmallp((long)iVar1);
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR CHAR_openfile(LispPTR *args)
/* args[0]            fullname */
/* args[1]            access */
/* args[2]            errno */
{
#ifndef DOS
  int fd;    /* return value  of open system call. */
  int flags; /* open system call's argument */
  /* struct stat statbuf; */
  char pathname[MAXPATHLEN];

  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringToCString(args[0], pathname, MAXPATHLEN);
  flags = O_NONBLOCK;
  ERRSETJMP(NIL);
  /*    TIMEOUT( rval=stat(pathname, &statbuf) );
      if(rval == 0){      } */
  switch (args[1]) {
    case ACCESS_INPUT: flags |= O_RDONLY; break;
    case ACCESS_OUTPUT: flags |= (O_WRONLY | O_CREAT); break;
    case ACCESS_APPEND: flags |= (O_APPEND | O_RDWR | O_CREAT); break;
    case ACCESS_BOTH: flags |= (O_RDWR | O_CREAT); break;
    default: return (NIL);
  }
  TIMEOUT(fd = open(pathname, flags));
  if (fd == -1) {
    err_mess("open", errno);
    *Lisp_errno = errno;
    return (NIL);
  }
  /* Prevent I/O requests from blocking -- make them error */
  /* if no char is available, or there's no room in pipe.  */
  fcntl(fd, F_SETFL, fcntl(fd, F_GETFL, 0) | O_NONBLOCK);

  return (GetSmallp(fd));
#endif /* DOS */
}